

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLookupResultValid
               (Texture1DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FilterMode FVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int coordY;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float __x;
  float __x_00;
  Vec2 local_38;
  
  if (texture->m_numLevels < 1) {
    iVar10 = -1;
  }
  else {
    iVar10 = (texture->m_levels->m_size).m_data[1] + -1;
  }
  fVar14 = coord->m_data[1];
  fVar12 = TexVerifierUtil::computeFloatingPointError(fVar14,(prec->coordBits).m_data[1]);
  fVar13 = floorf((fVar14 - fVar12) + 0.5);
  iVar8 = (int)fVar13;
  fVar14 = ceilf(fVar14 + fVar12 + 0.5);
  iVar2 = (int)fVar14 + -1;
  coordY = iVar10;
  if (iVar8 < iVar10) {
    coordY = iVar8;
  }
  if (iVar8 < 0) {
    coordY = 0;
  }
  if (iVar2 < iVar10) {
    iVar10 = iVar2;
  }
  if (iVar2 < 0) {
    iVar10 = 0;
  }
  if (coordY <= iVar10) {
    fVar14 = coord->m_data[0];
    __x = (float)*(undefined8 *)lodBounds->m_data;
    __x_00 = (float)((ulong)*(undefined8 *)lodBounds->m_data >> 0x20);
    fVar12 = sampler->lodThreshold;
    fVar13 = ceilf(__x + 0.5);
    iVar2 = (int)fVar13 + -1;
    fVar13 = floorf(__x_00 + 0.5);
    iVar8 = (int)fVar13;
    fVar13 = floorf(__x);
    iVar3 = (int)fVar13;
    fVar13 = floorf(__x_00);
    iVar4 = (int)fVar13;
    do {
      if ((__x <= fVar12) &&
         (bVar1 = isLevelSampleResultValid
                            (texture->m_levels,sampler,sampler->magFilter,prec,fVar14,coordY,result)
         , bVar1)) {
        return true;
      }
      if (fVar12 < __x_00) {
        FVar6 = sampler->minFilter;
        iVar9 = texture->m_numLevels + -1;
        if (iVar9 < 1 || (FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
          if ((FVar6 == LINEAR_MIPMAP_NEAREST) || (FVar6 == NEAREST_MIPMAP_NEAREST)) {
            iVar11 = iVar9;
            if (iVar2 < iVar9) {
              iVar11 = iVar2;
            }
            if (iVar2 < 0) {
              iVar11 = 0;
            }
            if (iVar8 < iVar9) {
              iVar9 = iVar8;
            }
            if (iVar8 < 0) {
              iVar9 = 0;
            }
            for (; iVar11 <= iVar9; iVar11 = iVar11 + 1) {
              uVar5 = sampler->minFilter - LINEAR;
              FVar6 = NEAREST;
              if (uVar5 < 5) {
                FVar6 = *(FilterMode *)(&DAT_00b62e90 + (ulong)uVar5 * 4);
              }
              bVar1 = isLevelSampleResultValid
                                (texture->m_levels + iVar11,sampler,FVar6,prec,fVar14,coordY,result)
              ;
              if (bVar1) {
                return true;
              }
            }
          }
          else {
            bVar1 = isLevelSampleResultValid
                              (texture->m_levels,sampler,FVar6,prec,fVar14,coordY,result);
            if (bVar1) {
              return true;
            }
          }
        }
        else {
          iVar11 = texture->m_numLevels + -2;
          iVar9 = iVar11;
          if (iVar3 < iVar11) {
            iVar9 = iVar3;
          }
          if (iVar3 < 0) {
            iVar9 = 0;
          }
          if (iVar4 < iVar11) {
            iVar11 = iVar4;
          }
          if (iVar4 < 0) {
            iVar11 = 0;
          }
          while (iVar9 <= iVar11) {
            uVar5 = sampler->minFilter - LINEAR;
            FVar6 = NEAREST;
            if (uVar5 < 5) {
              FVar6 = *(FilterMode *)(&DAT_00b62e90 + (ulong)uVar5 * 4);
            }
            fVar13 = (float)iVar9;
            auVar15._4_4_ = __x_00 - fVar13;
            auVar15._0_4_ = __x - fVar13;
            auVar15._8_4_ = 0.0 - fVar13;
            auVar15._12_4_ = 0.0 - fVar13;
            auVar15 = minps(_DAT_00aa9040,auVar15);
            lVar7 = (long)iVar9;
            iVar9 = iVar9 + 1;
            local_38.m_data[1] = (float)(-(uint)(0.0 <= __x_00 - fVar13) & auVar15._4_4_);
            local_38.m_data[0] = (float)(-(uint)(0.0 <= __x - fVar13) & auVar15._0_4_);
            bVar1 = isMipmapLinearSampleResultValid
                              (texture->m_levels + lVar7,texture->m_levels + iVar9,sampler,FVar6,
                               prec,fVar14,coordY,&local_38,result);
            if (bVar1) {
              return true;
            }
          }
        }
      }
      coordY = coordY + 1;
    } while (coordY <= iVar10);
  }
  return false;
}

Assistant:

bool isLookupResultValid (const Texture1DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.y(), coord.y());
	const float		coordX			= coord.x();
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordX, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordX, layer, result))
					return true;
			}
		}
	}

	return false;
}